

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadSamplerProperties(ColladaParser *this,Sampler *out)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Logger *this_00;
  char *pcVar3;
  ai_real aVar4;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
LAB_0040221a:
    do {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar2 == '\0') {
        return;
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) {
        bVar1 = IsElement(this,"wrapU");
        if (bVar1) {
          bVar1 = ReadBoolFromTextContent(this);
          out->mWrapU = bVar1;
          pcVar3 = "wrapU";
        }
        else {
          bVar1 = IsElement(this,"wrapV");
          if (bVar1) {
            bVar1 = ReadBoolFromTextContent(this);
            out->mWrapV = bVar1;
            pcVar3 = "wrapV";
          }
          else {
            bVar1 = IsElement(this,"mirrorU");
            if (bVar1) {
              bVar1 = ReadBoolFromTextContent(this);
              out->mMirrorU = bVar1;
              pcVar3 = "mirrorU";
            }
            else {
              pcVar3 = "mirrorV";
              bVar1 = IsElement(this,"mirrorV");
              if (bVar1) {
                bVar1 = ReadBoolFromTextContent(this);
                out->mMirrorV = bVar1;
              }
              else {
                pcVar3 = "repeatU";
                bVar1 = IsElement(this,"repeatU");
                if (bVar1) {
                  aVar4 = ReadFloatFromTextContent(this);
                  (out->mTransform).mScaling.x = aVar4;
                }
                else {
                  bVar1 = IsElement(this,"repeatV");
                  if (bVar1) {
                    aVar4 = ReadFloatFromTextContent(this);
                    (out->mTransform).mScaling.y = aVar4;
                    pcVar3 = "repeatV";
                  }
                  else {
                    bVar1 = IsElement(this,"offsetU");
                    if (bVar1) {
                      aVar4 = ReadFloatFromTextContent(this);
                      (out->mTransform).mTranslation.x = aVar4;
                      pcVar3 = "offsetU";
                    }
                    else {
                      bVar1 = IsElement(this,"offsetV");
                      if (bVar1) {
                        aVar4 = ReadFloatFromTextContent(this);
                        (out->mTransform).mTranslation.y = aVar4;
                        pcVar3 = "offsetV";
                      }
                      else {
                        bVar1 = IsElement(this,"rotateUV");
                        if (bVar1) {
                          aVar4 = ReadFloatFromTextContent(this);
                          (out->mTransform).mRotation = aVar4;
                          pcVar3 = "rotateUV";
                        }
                        else {
                          bVar1 = IsElement(this,"blend_mode");
                          if (bVar1) {
                            pcVar3 = GetTextContent(this);
                            iVar2 = ASSIMP_strincmp(pcVar3,"ADD",3);
                            if (iVar2 == 0) {
                              out->mOp = aiTextureOp_Add;
                            }
                            else {
                              iVar2 = ASSIMP_strincmp(pcVar3,"SUBTRACT",8);
                              if (iVar2 == 0) {
                                out->mOp = aiTextureOp_Subtract;
                              }
                              else {
                                iVar2 = ASSIMP_strincmp(pcVar3,"MULTIPLY",8);
                                if (iVar2 == 0) {
                                  out->mOp = aiTextureOp_Multiply;
                                }
                                else {
                                  this_00 = DefaultLogger::get();
                                  Logger::warn(this_00,
                                               "Collada: Unsupported MAYA texture blend mode");
                                }
                              }
                            }
                            pcVar3 = "blend_mode";
                          }
                          else {
                            bVar1 = IsElement(this,"weighting");
                            if (bVar1) {
                              aVar4 = ReadFloatFromTextContent(this);
                              out->mWeighting = aVar4;
                              pcVar3 = "weighting";
                            }
                            else {
                              bVar1 = IsElement(this,"mix_with_previous_layer");
                              if (bVar1) {
                                aVar4 = ReadFloatFromTextContent(this);
                                out->mMixWithPrevious = aVar4;
                                pcVar3 = "mix_with_previous_layer";
                              }
                              else {
                                bVar1 = IsElement(this,"amount");
                                if (!bVar1) goto LAB_0040221a;
                                aVar4 = ReadFloatFromTextContent(this);
                                out->mWeighting = aVar4;
                                pcVar3 = "amount";
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        TestClosing(this,pcVar3);
        goto LAB_0040221a;
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 != 2) goto LAB_0040221a;
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"technique");
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void ColladaParser::ReadSamplerProperties(Sampler& out)
{
    if (mReader->isEmptyElement()) {
        return;
    }

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {

            // MAYA extensions
            // -------------------------------------------------------
            if (IsElement("wrapU")) {
                out.mWrapU = ReadBoolFromTextContent();
                TestClosing("wrapU");
            }
            else if (IsElement("wrapV")) {
                out.mWrapV = ReadBoolFromTextContent();
                TestClosing("wrapV");
            }
            else if (IsElement("mirrorU")) {
                out.mMirrorU = ReadBoolFromTextContent();
                TestClosing("mirrorU");
            }
            else if (IsElement("mirrorV")) {
                out.mMirrorV = ReadBoolFromTextContent();
                TestClosing("mirrorV");
            }
            else if (IsElement("repeatU")) {
                out.mTransform.mScaling.x = ReadFloatFromTextContent();
                TestClosing("repeatU");
            }
            else if (IsElement("repeatV")) {
                out.mTransform.mScaling.y = ReadFloatFromTextContent();
                TestClosing("repeatV");
            }
            else if (IsElement("offsetU")) {
                out.mTransform.mTranslation.x = ReadFloatFromTextContent();
                TestClosing("offsetU");
            }
            else if (IsElement("offsetV")) {
                out.mTransform.mTranslation.y = ReadFloatFromTextContent();
                TestClosing("offsetV");
            }
            else if (IsElement("rotateUV")) {
                out.mTransform.mRotation = ReadFloatFromTextContent();
                TestClosing("rotateUV");
            }
            else if (IsElement("blend_mode")) {

                const char* sz = GetTextContent();
                // http://www.feelingsoftware.com/content/view/55/72/lang,en/
                // NONE, OVER, IN, OUT, ADD, SUBTRACT, MULTIPLY, DIFFERENCE, LIGHTEN, DARKEN, SATURATE, DESATURATE and ILLUMINATE
                if (0 == ASSIMP_strincmp(sz, "ADD", 3))
                    out.mOp = aiTextureOp_Add;

                else if (0 == ASSIMP_strincmp(sz, "SUBTRACT", 8))
                    out.mOp = aiTextureOp_Subtract;

                else if (0 == ASSIMP_strincmp(sz, "MULTIPLY", 8))
                    out.mOp = aiTextureOp_Multiply;

                else {
                    ASSIMP_LOG_WARN("Collada: Unsupported MAYA texture blend mode");
                }
                TestClosing("blend_mode");
            }
            // OKINO extensions
            // -------------------------------------------------------
            else if (IsElement("weighting")) {
                out.mWeighting = ReadFloatFromTextContent();
                TestClosing("weighting");
            }
            else if (IsElement("mix_with_previous_layer")) {
                out.mMixWithPrevious = ReadFloatFromTextContent();
                TestClosing("mix_with_previous_layer");
            }
            // MAX3D extensions
            // -------------------------------------------------------
            else if (IsElement("amount")) {
                out.mWeighting = ReadFloatFromTextContent();
                TestClosing("amount");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "technique") == 0)
                break;
        }
    }
}